

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::BeginFrameSourceState::operator==
          (BeginFrameSourceState *this,BeginFrameSourceState *other)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  
  __n = (this->unknown_fields_)._M_string_length;
  if (__n == (other->unknown_fields_)._M_string_length) {
    if ((__n != 0) &&
       (iVar2 = bcmp((this->unknown_fields_)._M_dataplus._M_p,
                     (other->unknown_fields_)._M_dataplus._M_p,__n), iVar2 != 0)) {
      return false;
    }
    if (((this->source_id_ == other->source_id_) && (this->paused_ == other->paused_)) &&
       (this->num_observers_ == other->num_observers_)) {
      bVar1 = BeginFrameArgs::operator==
                        ((this->last_begin_frame_args_).ptr_._M_t.
                         super___uniq_ptr_impl<perfetto::protos::gen::BeginFrameArgs,_std::default_delete<perfetto::protos::gen::BeginFrameArgs>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_perfetto::protos::gen::BeginFrameArgs_*,_std::default_delete<perfetto::protos::gen::BeginFrameArgs>_>
                         .super__Head_base<0UL,_perfetto::protos::gen::BeginFrameArgs_*,_false>.
                         _M_head_impl,
                         (other->last_begin_frame_args_).ptr_._M_t.
                         super___uniq_ptr_impl<perfetto::protos::gen::BeginFrameArgs,_std::default_delete<perfetto::protos::gen::BeginFrameArgs>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_perfetto::protos::gen::BeginFrameArgs_*,_std::default_delete<perfetto::protos::gen::BeginFrameArgs>_>
                         .super__Head_base<0UL,_perfetto::protos::gen::BeginFrameArgs_*,_false>.
                         _M_head_impl);
      return bVar1;
    }
  }
  return false;
}

Assistant:

T&& value() && {
    PERFETTO_CHECK(storage_.is_populated_);
    return std::move(storage_.value_);
  }